

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O0

void brotli::ClusterHistograms<brotli::Histogram<256>>
               (vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *in,
               size_t num_contexts,size_t num_blocks,size_t max_histograms,
               vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram_symbols)

{
  pointer puVar1;
  value_type vVar2;
  pointer puVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  reference pvVar8;
  double dVar9;
  unsigned_long local_98;
  unsigned_long local_90;
  size_t num_to_combine;
  size_t i_1;
  size_t max_input_histograms;
  size_t i;
  allocator<unsigned_int> local_5d;
  value_type_conflict local_5c;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> cluster_size;
  size_t in_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram_symbols_local;
  vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *out_local;
  size_t max_histograms_local;
  size_t num_blocks_local;
  size_t num_contexts_local;
  vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *in_local;
  
  cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(num_contexts * num_blocks);
  puVar3 = (pointer)std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
                    size(in);
  puVar1 = cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if ((pointer)(num_contexts * num_blocks) == puVar3) {
    local_5c = 1;
    std::allocator<unsigned_int>::allocator(&local_5d);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,(size_type)puVar1,
               &local_5c,&local_5d);
    std::allocator<unsigned_int>::~allocator(&local_5d);
    std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::resize
              (out,(size_type)
                   cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (histogram_symbols,
               (size_type)
               cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    for (max_input_histograms = 0;
        max_input_histograms <
        cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage; max_input_histograms = max_input_histograms + 1)
    {
      pvVar4 = std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
               operator[](in,max_input_histograms);
      pvVar5 = std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
               operator[](out,max_input_histograms);
      memcpy(pvVar5,pvVar4,0x410);
      pvVar4 = std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
               operator[](in,max_input_histograms);
      dVar9 = PopulationCost<256>(pvVar4);
      pvVar5 = std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
               operator[](out,max_input_histograms);
      pvVar5->bit_cost_ = dVar9;
      vVar2 = (value_type)max_input_histograms;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (histogram_symbols,max_input_histograms);
      *pvVar6 = vVar2;
    }
    i_1 = 0x40;
    for (num_to_combine = 0;
        num_to_combine <
        cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage; num_to_combine = num_to_combine + 0x40) {
      local_98 = (long)cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage - num_to_combine;
      puVar7 = std::min<unsigned_long>(&local_98,&i_1);
      local_90 = *puVar7;
      pvVar5 = std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
               operator[](out,0);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (histogram_symbols,num_to_combine);
      HistogramCombine<brotli::Histogram<256>>(pvVar5,pvVar6,pvVar8,local_90,max_histograms);
    }
    pvVar5 = std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
             operator[](out,0);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,0);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (histogram_symbols,0);
    HistogramCombine<brotli::Histogram<256>>
              (pvVar5,pvVar6,pvVar8,
               (size_t)cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,max_histograms);
    pvVar4 = std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
             operator[](in,0);
    puVar1 = cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pvVar5 = std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::
             operator[](out,0);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (histogram_symbols,0);
    HistogramRemap<brotli::Histogram<256>>(pvVar4,(size_t)puVar1,pvVar5,pvVar6);
    HistogramReindex<brotli::Histogram<256>>(out,histogram_symbols);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    return;
  }
  __assert_fail("in_size == in.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./cluster.h"
                ,0x106,
                "void brotli::ClusterHistograms(const std::vector<HistogramType> &, size_t, size_t, size_t, std::vector<HistogramType> *, std::vector<uint32_t> *) [HistogramType = brotli::Histogram<256>]"
               );
}

Assistant:

void ClusterHistograms(const std::vector<HistogramType>& in,
                       size_t num_contexts, size_t num_blocks,
                       size_t max_histograms,
                       std::vector<HistogramType>* out,
                       std::vector<uint32_t>* histogram_symbols) {
  const size_t in_size = num_contexts * num_blocks;
  assert(in_size == in.size());
  std::vector<uint32_t> cluster_size(in_size, 1);
  out->resize(in_size);
  histogram_symbols->resize(in_size);
  for (size_t i = 0; i < in_size; ++i) {
    (*out)[i] = in[i];
    (*out)[i].bit_cost_ = PopulationCost(in[i]);
    (*histogram_symbols)[i] = static_cast<uint32_t>(i);
  }


  const size_t max_input_histograms = 64;
  for (size_t i = 0; i < in_size; i += max_input_histograms) {
    size_t num_to_combine = std::min(in_size - i, max_input_histograms);
    HistogramCombine(&(*out)[0], &cluster_size[0],
                     &(*histogram_symbols)[i], num_to_combine,
                     max_histograms);
  }

  // Collapse similar histograms.
  HistogramCombine(&(*out)[0], &cluster_size[0],
                   &(*histogram_symbols)[0], in_size,
                   max_histograms);

  // Find the optimal map from original histograms to the final ones.
  HistogramRemap(&in[0], in_size, &(*out)[0], &(*histogram_symbols)[0]);

  // Convert the context map to a canonical form.
  HistogramReindex(out, histogram_symbols);

}